

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib507.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  timeval older_01;
  CURLMcode ec_7;
  int ec_6;
  CURLMcode ec_5;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval timeout;
  CURLMcode ec_4;
  CURLMcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_48;
  CURLMsg *msg;
  int local_30;
  int res;
  int i;
  int still_running;
  CURLM *multi;
  CURL *curls;
  char *URL_local;
  
  multi = (CURLM *)0x0;
  _i = 0;
  local_30 = -1;
  msg._4_4_ = 0;
  curls = (CURL *)URL;
  tVar7 = tutil_tvnow();
  _ec_1 = tVar7.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_48 = tVar7.tv_usec;
  tv_test_start.tv_usec = local_48;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                  ,0x29,iVar2,uVar3);
    msg._4_4_ = iVar2;
  }
  if (msg._4_4_ == 0) {
    _i = curl_multi_init();
    if (_i == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                    ,0x2b);
      msg._4_4_ = 0x7b;
    }
    if (msg._4_4_ == 0) {
      multi = (CURLM *)curl_easy_init();
      if (multi == (CURLM *)0x0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                      ,0x2d);
        msg._4_4_ = 0x7c;
      }
      if (msg._4_4_ == 0) {
        iVar2 = curl_easy_setopt(multi,0x2712,curls);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                        ,0x2f,iVar2,uVar3);
          msg._4_4_ = iVar2;
        }
        if (msg._4_4_ == 0) {
          iVar2 = curl_easy_setopt(multi,0x2a,1);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                          ,0x30,iVar2,uVar3);
            msg._4_4_ = iVar2;
          }
          if (msg._4_4_ == 0) {
            iVar2 = curl_multi_add_handle(_i,multi);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                            ,0x32,iVar2,uVar3);
              msg._4_4_ = iVar2;
            }
            if (msg._4_4_ == 0) {
              iVar2 = curl_multi_perform(_i,&res);
              uVar1 = _stderr;
              if (iVar2 == 0) {
                if (res < 0) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                ,0x34,res);
                  msg._4_4_ = 0x7a;
                }
              }
              else {
                uVar3 = curl_multi_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                              ,0x34,iVar2,uVar3);
                msg._4_4_ = iVar2;
              }
              if (msg._4_4_ == 0) {
                tVar7 = tutil_tvnow();
                older.tv_usec = tv_test_start.tv_usec;
                older.tv_sec = tv_test_start.tv_sec;
                lVar4 = tutil_tvdiff(tVar7,older);
                if (60000 < lVar4) {
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                ,0x36);
                  msg._4_4_ = 0x7d;
                }
                while (msg._4_4_ == 0) {
                  if (res == 0) {
                    lVar4 = curl_multi_info_read(_i,&res);
                    if (lVar4 != 0) {
                      local_30 = *(int *)(lVar4 + 0x10);
                    }
                    break;
                  }
                  __arr._4_4_ = -99;
                  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
                    fdwrite.__fds_bits[(ulong)(uint)__arr + 0xf] = 0;
                  }
                  for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
                    fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                  }
                  for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
                    (&__i + (ulong)__arr_2._4_4_ * 2)[0] = 0;
                    (&__i + (ulong)__arr_2._4_4_ * 2)[1] = 0;
                  }
                  fdread.__fds_bits[0xf] = 1;
                  iVar2 = curl_multi_fdset(_i,fdwrite.__fds_bits + 0xf,fdexcep.__fds_bits + 0xf,&__i
                                           ,(long)&__arr + 4);
                  uVar1 = _stderr;
                  if (iVar2 == 0) {
                    if (__arr._4_4_ < -1) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                    ,0x45,__arr._4_4_);
                      msg._4_4_ = 0x7a;
                    }
                  }
                  else {
                    uVar3 = curl_multi_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                  ,0x45,iVar2,uVar3);
                    msg._4_4_ = iVar2;
                  }
                  if (msg._4_4_ != 0) break;
                  iVar2 = select_wrapper(__arr._4_4_ + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                                         (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&__i,
                                         (timeval *)(fdread.__fds_bits + 0xf));
                  if (iVar2 == -1) {
                    piVar5 = __errno_location();
                    uVar1 = _stderr;
                    iVar2 = *piVar5;
                    pcVar6 = strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                  ,0x49,iVar2,pcVar6);
                    msg._4_4_ = 0x79;
                  }
                  if (msg._4_4_ != 0) break;
                  tVar7 = tutil_tvnow();
                  older_00.tv_usec = tv_test_start.tv_usec;
                  older_00.tv_sec = tv_test_start.tv_sec;
                  lVar4 = tutil_tvdiff(tVar7,older_00);
                  if (60000 < lVar4) {
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                  ,0x4b);
                    msg._4_4_ = 0x7d;
                  }
                  if (msg._4_4_ != 0) break;
                  iVar2 = curl_multi_perform(_i,&res);
                  uVar1 = _stderr;
                  if (iVar2 == 0) {
                    if (res < 0) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                    ,0x4d,res);
                      msg._4_4_ = 0x7a;
                    }
                  }
                  else {
                    uVar3 = curl_multi_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                  ,0x4d,iVar2,uVar3);
                    msg._4_4_ = iVar2;
                  }
                  if (msg._4_4_ != 0) break;
                  tVar7 = tutil_tvnow();
                  older_01.tv_usec = tv_test_start.tv_usec;
                  older_01.tv_sec = tv_test_start.tv_sec;
                  lVar4 = tutil_tvdiff(tVar7,older_01);
                  if (60000 < lVar4) {
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                  ,0x4f);
                    msg._4_4_ = 0x7d;
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_multi_cleanup(_i);
    curl_easy_cleanup(multi);
    curl_global_cleanup();
    if (msg._4_4_ != 0) {
      local_30 = msg._4_4_;
    }
    URL_local._4_4_ = local_30;
  }
  else {
    URL_local._4_4_ = msg._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = -1;
  int res = 0;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}